

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.h
# Opt level: O0

stref idx2::ToString(mmap_err_code Enum)

{
  undefined8 uVar1;
  undefined4 uVar2;
  stref sVar3;
  name_map *local_48;
  enum_item *It;
  mmap_err_code_s EnumS;
  mmap_err_code Enum_local;
  
  It._4_4_ = Enum;
  mmap_err_code_s::mmap_err_code_s((mmap_err_code_s *)&It,Enum);
  for (local_48 = &mmap_err_code_s::NameMap;
      (local_48 != (name_map *)&mmap_err_code_s::NameMap.Len &&
      (local_48->Arr[0].ItemVal != (mmap_err_code)It)); local_48 = (name_map *)(local_48->Arr + 1))
  {
  }
  if (local_48 == (name_map *)&mmap_err_code_s::NameMap.Len) {
    __assert_fail("It != End(EnumS.NameMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Applications/../Core/MemoryMap.h"
                  ,0x28,"stref idx2::ToString(mmap_err_code)");
  }
  uVar1 = local_48->Arr[0].Name.field_0;
  uVar2 = local_48->Arr[0].Name.Size;
  sVar3.Size = uVar2;
  sVar3.field_0 = (anon_union_8_2_2df48d06_for_stref_0)uVar1;
  sVar3._12_4_ = 0;
  return sVar3;
}

Assistant:

idx2_Enum(mmap_err_code,
          int,
          idx2_CommonErrs,
          MappingFailed,
          MapViewFailed,
          AllocateFailed,
          FlushFailed,
          SyncFailed,
          UnmapFailed);


namespace idx2
{


enum class map_mode
{
  Read,
  Write
};

#if defined(_WIN32)
using file_handle = HANDLE;
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
using file_handle = int;
#endif

struct mmap_file
{
  file_handle File;
  file_handle FileMapping;
  map_mode Mode;
  buffer Buf;
};

error<mmap_err_code>
OpenFile(mmap_file* MMap, cstr Name, map_mode Mode);

error<mmap_err_code>
MapFile(mmap_file* MMap, i64 Bytes = 0);

error<mmap_err_code>
FlushFile(mmap_file* MMap, byte* Start = nullptr, i64 Bytes = 0);

error<mmap_err_code>
SyncFile(mmap_file* MMap);

error<mmap_err_code>
UnmapFile(mmap_file* MMap);

error<mmap_err_code>
CloseFile(mmap_file* MMap);

template <typename t> void
Write(mmap_file* MMap, const t* Data);

template <typename t> void
Write(mmap_file* MMap, const t* Data, i64 Size);

template <typename t> void
Write(mmap_file* MMap, t Val);


}